

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O0

Result_t *
Kumu::ReadFileIntoString
          (Result_t *__return_storage_ptr__,string *filename,string *outString,ui32_t max_size)

{
  int iVar1;
  ui32_t buf_len;
  fsize_t fVar2;
  ILogSink *this;
  undefined8 uVar3;
  byte_t *pbVar4;
  Result_t local_1d0;
  Result_t local_168;
  undefined4 local_fc;
  undefined1 local_f8 [8];
  Result_t result;
  undefined1 local_80 [8];
  ByteString ReadBuf;
  FileReader File;
  ui32_t uStack_30;
  ui32_t read_size;
  fsize_t fsize;
  ui32_t max_size_local;
  string *outString_local;
  string *filename_local;
  
  File._44_4_ = 0;
  FileReader::FileReader((FileReader *)&ReadBuf.m_Capacity);
  ByteString::ByteString((ByteString *)local_80);
  FileReader::OpenRead((Result_t *)local_f8,(FileReader *)&ReadBuf.m_Capacity,filename);
  iVar1 = Result_t::operator_cast_to_int((Result_t *)local_f8);
  if (-1 < iVar1) {
    fVar2 = FileReader::Size((FileReader *)&ReadBuf.m_Capacity);
    if ((long)(ulong)max_size < fVar2) {
      this = DefaultLogSink();
      uVar3 = std::__cxx11::string::c_str();
      ILogSink::Error(this,"%s: exceeds available buffer size (%u)\n",uVar3,(ulong)max_size);
      Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_ALLOC);
      goto LAB_001269e7;
    }
    if (fVar2 == 0) {
      std::__cxx11::string::operator=((string *)outString,"");
      Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_OK);
      goto LAB_001269e7;
    }
    uStack_30 = (ui32_t)fVar2;
    ByteString::Capacity(&local_168,(ByteString *)local_80,uStack_30);
    Result_t::operator=((Result_t *)local_f8,&local_168);
    Result_t::~Result_t(&local_168);
  }
  iVar1 = Result_t::operator_cast_to_int((Result_t *)local_f8);
  if (-1 < iVar1) {
    pbVar4 = ByteString::Data((ByteString *)local_80);
    buf_len = ByteString::Capacity((ByteString *)local_80);
    FileReader::Read(&local_1d0,(FileReader *)&ReadBuf.m_Capacity,pbVar4,buf_len,
                     (ui32_t *)&File.field_0x2c);
    Result_t::operator=((Result_t *)local_f8,&local_1d0);
    Result_t::~Result_t(&local_1d0);
  }
  iVar1 = Result_t::operator_cast_to_int((Result_t *)local_f8);
  if (-1 < iVar1) {
    pbVar4 = ByteString::RoData((ByteString *)local_80);
    std::__cxx11::string::assign((char *)outString,(ulong)pbVar4);
  }
  Result_t::Result_t(__return_storage_ptr__,(Result_t *)local_f8);
LAB_001269e7:
  local_fc = 1;
  Result_t::~Result_t((Result_t *)local_f8);
  ByteString::~ByteString((ByteString *)local_80);
  FileReader::~FileReader((FileReader *)&ReadBuf.m_Capacity);
  return __return_storage_ptr__;
}

Assistant:

Kumu::Result_t
Kumu::ReadFileIntoString(const std::string& filename, std::string& outString, ui32_t max_size)
{
  fsize_t    fsize = 0;
  ui32_t     read_size = 0;
  FileReader File;
  ByteString ReadBuf;

  Result_t result = File.OpenRead(filename);

  if ( KM_SUCCESS(result) )
    {
      fsize = File.Size();

      if ( fsize > (Kumu::fpos_t)max_size )
	{
	  DefaultLogSink().Error("%s: exceeds available buffer size (%u)\n", filename.c_str(), max_size);
	  return RESULT_ALLOC;
	}

      if ( fsize == 0 )
	{
	  outString = "";
	  return RESULT_OK;
	}

      result = ReadBuf.Capacity((ui32_t)fsize);
    }

  if ( KM_SUCCESS(result) )
    result = File.Read(ReadBuf.Data(), ReadBuf.Capacity(), &read_size);

  if ( KM_SUCCESS(result) )
    outString.assign((const char*)ReadBuf.RoData(), read_size);

  return result;
}